

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

void __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::expand(Set<SAT::SATLiteral,_Lib::DefaultHash> *this)

{
  int iVar1;
  Cell *array;
  bool bVar2;
  uint uVar3;
  Cell *pCVar4;
  Set<SAT::SATLiteral,_Lib::DefaultHash> *in_RDI;
  undefined1 auVar5 [16];
  int remaining;
  Cell *current;
  size_t oldCapacity;
  void *mem;
  Cell *oldEntries;
  size_t newCapacity;
  undefined4 in_stack_ffffffffffffffb0;
  uint code;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_34;
  Cell *local_30;
  
  if (in_RDI->_capacity == 0) {
    uVar3 = 0x1f;
  }
  else {
    uVar3 = in_RDI->_capacity << 1;
  }
  array = in_RDI->_entries;
  code = uVar3;
  Lib::alloc(CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  pCVar4 = array_new<Lib::Set<SAT::SATLiteral,Lib::DefaultHash>::Cell>
                     ((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0._content)
                      ,(size_t)in_RDI);
  in_RDI->_entries = pCVar4;
  in_RDI->_afterLast = in_RDI->_entries + (int)uVar3;
  auVar5._8_4_ = (int)uVar3 >> 0x1f;
  auVar5._0_8_ = (long)(int)uVar3;
  auVar5._12_4_ = 0x45300000;
  in_RDI->_maxEntries =
       (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) * 0.8);
  iVar1 = in_RDI->_capacity;
  in_RDI->_capacity = uVar3;
  local_34 = in_RDI->_size;
  in_RDI->_nonemptyCells = 0;
  in_RDI->_size = 0;
  local_30 = array;
  for (; local_34 != 0; local_34 = local_34 - 1) {
    while (bVar2 = Cell::occupied(local_30), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_30 = local_30 + 1;
    }
    insert(in_RDI,(SATLiteral)in_stack_ffffffffffffffc0.field_1,code);
    local_30 = local_30 + 1;
  }
  if (array != (Cell *)0x0) {
    array_delete<Lib::Set<SAT::SATLiteral,Lib::DefaultHash>::Cell>(array,(long)iVar1);
    Lib::free(array);
  }
  return;
}

Assistant:

void expand()
  {
    size_t newCapacity = _capacity ? _capacity * 2 : 31;
    Cell* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Cell),"Set::Cell");

    _entries = array_new<Cell>(mem, newCapacity);
    _afterLast = _entries + newCapacity;
    _maxEntries = (int)(newCapacity * 0.8);
    size_t oldCapacity = _capacity;
    _capacity = newCapacity;

    // experiments using (a) random numbers (b) consecutive numbers
    // and 30,000,000 allocations
    // 0.6 :  8.49 7.55
    // 0.7 :  9.19 7.71
    // 0.8 :  9.10 8.44
    // 0.9 :  9.34 7.36 (fewer allocations (21 vs. 22), fewer cache faults)
    // 0.95: 10.21 7.48
    // copy old entries
    Cell* current = oldEntries;
    int remaining = _size;
    _nonemptyCells = 0;
    _size = 0;
    while (remaining != 0) {
      // find first occupied cell
      while (! current->occupied()) {
	current++;
      }
      // now current is occupied
      insert(current->value,current->code);
      current ++;
      remaining --;
    }

    if (oldEntries) {
      array_delete(oldEntries,oldCapacity);
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Cell),"Set::Cell");
    }
  }